

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void destroy_loop_tree(gen_ctx_t gen_ctx,loop_node_t_conflict root)

{
  gen_ctx_t pgVar1;
  gen_ctx_t gen_ctx_00;
  
  if (*(long *)&gen_ctx->optimize_level == 0) {
    gen_ctx_00 = (gen_ctx_t)gen_ctx->to_free;
    while (gen_ctx_00 != (gen_ctx_t)0x0) {
      pgVar1 = (gen_ctx_t)gen_ctx_00->addr_regs;
      destroy_loop_tree(gen_ctx_00,root);
      gen_ctx_00 = pgVar1;
    }
  }
  else {
    *(undefined8 *)&gen_ctx->debug_level = 0;
    *(undefined8 *)(*(long *)&gen_ctx->optimize_level + 0x98) = 0;
  }
  free(gen_ctx);
  return;
}

Assistant:

static void destroy_loop_tree (gen_ctx_t gen_ctx, loop_node_t root) {
  loop_node_t node, next;

  if (root->bb != NULL) {
    root->u.preheader_loop = NULL;
    root->bb->loop_node = NULL;
  } else {
    for (node = DLIST_HEAD (loop_node_t, root->children); node != NULL; node = next) {
      next = DLIST_NEXT (loop_node_t, node);
      destroy_loop_tree (gen_ctx, node);
    }
  }
  free (root);
}